

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapArea_rec(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,Vec_Vec_t *vLuts)

{
  int iVar1;
  Ivy_Supp_t *pIVar2;
  Ivy_Obj_t *pObj_00;
  int local_38;
  int local_34;
  int Counter;
  int i;
  Ivy_Supp_t *pSupp;
  Vec_Vec_t *vLuts_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  pIVar2 = Ivy_ObjSupp(pAig,pObj);
  if ((pIVar2->fMark == '\0') && (pIVar2->nSize != '\x01')) {
    pIVar2->fMark = '\x01';
    local_38 = 0;
    for (local_34 = 0; local_34 < pIVar2->nSize; local_34 = local_34 + 1) {
      pObj_00 = Ivy_ManObj(pAig,*(int *)(&pIVar2[1].nSize + (long)local_34 * 4));
      iVar1 = Ivy_FastMapArea_rec(pAig,pObj_00,vLuts);
      local_38 = iVar1 + local_38;
    }
    Vec_VecPush(vLuts,(int)pIVar2->Delay,pObj);
    pAig_local._4_4_ = local_38 + 1;
  }
  else {
    pAig_local._4_4_ = 0;
  }
  return pAig_local._4_4_;
}

Assistant:

int Ivy_FastMapArea_rec( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, Vec_Vec_t * vLuts )
{
    Ivy_Supp_t * pSupp;
    int i, Counter;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    // skip visited nodes and PIs
    if ( pSupp->fMark || pSupp->nSize == 1 )
        return 0;
    pSupp->fMark = 1;
    // compute the area of this node
    Counter = 0;
    for ( i = 0; i < pSupp->nSize; i++ )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ManObj(pAig, pSupp->pArray[i]), vLuts );
    // add the node to the array of LUTs
    Vec_VecPush( vLuts, pSupp->Delay, pObj );
    return 1 + Counter;
}